

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_textures(HL1MDLLoader *this)

{
  int iVar1;
  uint uVar2;
  Header_HL1 *pHVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  aiTexture **ppaVar6;
  aiMaterial **ppaVar7;
  aiTexture *this_00;
  aiMaterial *this_01;
  long lVar8;
  long lVar9;
  aiTextureFlags local_484;
  aiBlendMode local_480;
  aiTextureFlags use_alpha;
  aiBlendMode blend_mode;
  aiShadingMode shading_mode;
  int chrome;
  undefined1 local_44c [8];
  aiString texture_name;
  aiTextureType texture_type;
  aiMaterial *scene_material;
  aiColor3D last_palette_color;
  int i;
  uchar *pin;
  Texture_HL1 *ptexture;
  HL1MDLLoader *this_local;
  
  pHVar3 = this->texture_header_;
  iVar1 = this->texture_header_->textureindex;
  unique0x00012000 = this->texture_buffer_;
  uVar2 = this->texture_header_->numtextures;
  this->scene_->mNumMaterials = uVar2;
  this->scene_->mNumTextures = uVar2;
  auVar4 = ZEXT416(this->scene_->mNumTextures) * ZEXT816(8);
  uVar5 = auVar4._0_8_;
  if (auVar4._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppaVar6 = (aiTexture **)operator_new__(uVar5);
  this->scene_->mTextures = ppaVar6;
  auVar4 = ZEXT416(this->scene_->mNumMaterials) * ZEXT816(8);
  uVar5 = auVar4._0_8_;
  if (auVar4._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppaVar7 = (aiMaterial **)operator_new__(uVar5);
  this->scene_->mMaterials = ppaVar7;
  for (last_palette_color.g = 0.0; (int)last_palette_color.g < this->texture_header_->numtextures;
      last_palette_color.g = (ai_real)((int)last_palette_color.g + 1)) {
    this_00 = (aiTexture *)operator_new(0x428);
    aiTexture::aiTexture(this_00);
    this->scene_->mTextures[(int)last_palette_color.g] = this_00;
    aiColor3D::aiColor3D((aiColor3D *)&scene_material);
    lVar8 = (long)(int)last_palette_color.g;
    lVar9 = lVar8 * 0x50;
    read_texture(this,(Texture_HL1 *)
                      ((&pHVar3->super_HalfLifeMDLBaseHeader)[lVar8 * 10].ident + iVar1),
                 stack0xffffffffffffffe0 + *(int *)((long)pHVar3->eyeposition + lVar9 + iVar1),
                 stack0xffffffffffffffe0 + *(int *)((long)pHVar3->eyeposition + lVar9 + iVar1) +
                 *(int *)((long)pHVar3->eyeposition + lVar9 + iVar1 + -8) *
                 *(int *)((long)pHVar3->eyeposition + lVar9 + iVar1 + -4),
                 this->scene_->mTextures[lVar8],(aiColor3D *)&scene_material);
    this_01 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_01);
    this->scene_->mMaterials[(int)last_palette_color.g] = this_01;
    texture_name.data[0x3f8] = '\x01';
    texture_name.data[0x3f9] = '\0';
    texture_name.data[0x3fa] = '\0';
    texture_name.data[0x3fb] = '\0';
    lVar8 = (long)(int)last_palette_color.g;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&chrome,(&pHVar3->super_HalfLifeMDLBaseHeader)[lVar8 * 10].ident + iVar1,
               (allocator<char> *)((long)&shading_mode + 3));
    aiString::aiString((aiString *)local_44c,(string *)&chrome);
    std::__cxx11::string::~string((string *)&chrome);
    std::allocator<char>::~allocator((allocator<char> *)((long)&shading_mode + 3));
    aiMaterial::AddProperty(this_01,(aiString *)local_44c,"$tex.file",1,0);
    blend_mode = (aiBlendMode)
                 ((*(uint *)((long)pHVar3->eyeposition +
                            (long)(int)last_palette_color.g * 0x50 + (long)iVar1 + -0xc) & 2) != 0);
    aiMaterial::AddProperty(this_01,(int *)&blend_mode,1,"$mat.HL1.chrome",1,0);
    if ((*(uint *)((long)pHVar3->eyeposition +
                  (long)(int)last_palette_color.g * 0x50 + (long)iVar1 + -0xc) & 1) != 0) {
      use_alpha = aiTextureFlags_Invert;
      aiMaterial::AddProperty<aiShadingMode>(this_01,&use_alpha,1,"$mat.shadingm",0,0);
    }
    if ((*(uint *)((long)pHVar3->eyeposition +
                  (long)(int)last_palette_color.g * 0x50 + (long)iVar1 + -0xc) & 0x20) == 0) {
      if ((*(uint *)((long)pHVar3->eyeposition +
                    (long)(int)last_palette_color.g * 0x50 + (long)iVar1 + -0xc) & 0x40) != 0) {
        local_484 = aiTextureFlags_UseAlpha;
        aiMaterial::AddProperty<aiTextureFlags>(this_01,&local_484,1,"$tex.flags",1,0);
        aiMaterial::AddProperty(this_01,(aiColor3D *)&scene_material,1,"$clr.transparent",0,0);
      }
    }
    else {
      local_480 = aiBlendMode_Additive;
      aiMaterial::AddProperty<aiBlendMode>(this_01,&local_480,1,"$mat.blend",0,0);
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::read_textures() {
    const Texture_HL1 *ptexture = (const Texture_HL1 *)((uint8_t *)texture_header_ + texture_header_->textureindex);
    unsigned char *pin = texture_buffer_;

    scene_->mNumTextures = scene_->mNumMaterials = texture_header_->numtextures;
    scene_->mTextures = new aiTexture *[scene_->mNumTextures];
    scene_->mMaterials = new aiMaterial *[scene_->mNumMaterials];

    for (int i = 0; i < texture_header_->numtextures; ++i) {
        scene_->mTextures[i] = new aiTexture();

        aiColor3D last_palette_color;
        read_texture(&ptexture[i],
                pin + ptexture[i].index,
                pin + ptexture[i].width * ptexture[i].height + ptexture[i].index,
                scene_->mTextures[i],
                last_palette_color);

        aiMaterial *scene_material = scene_->mMaterials[i] = new aiMaterial();

        const aiTextureType texture_type = aiTextureType_DIFFUSE;
        aiString texture_name(ptexture[i].name);
        scene_material->AddProperty(&texture_name, AI_MATKEY_TEXTURE(texture_type, 0));

        // Is this a chrome texture?
        int chrome = ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_CHROME ? 1 : 0;
        scene_material->AddProperty(&chrome, 1, AI_MDL_HL1_MATKEY_CHROME(texture_type, 0));

        if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_FLATSHADE) {
            // Flat shading.
            const aiShadingMode shading_mode = aiShadingMode_Flat;
            scene_material->AddProperty(&shading_mode, 1, AI_MATKEY_SHADING_MODEL);
        }

        if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_ADDITIVE) {
            // Additive texture.
            const aiBlendMode blend_mode = aiBlendMode_Additive;
            scene_material->AddProperty(&blend_mode, 1, AI_MATKEY_BLEND_FUNC);
        } else if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_MASKED) {
            // Texture with 1 bit alpha test.
            const aiTextureFlags use_alpha = aiTextureFlags_UseAlpha;
            scene_material->AddProperty(&use_alpha, 1, AI_MATKEY_TEXFLAGS(texture_type, 0));
            scene_material->AddProperty(&last_palette_color, 1, AI_MATKEY_COLOR_TRANSPARENT);
        }
    }
}